

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

string * __thiscall Parser::get_animal_abi_cxx11_(string *__return_storage_ptr__,Parser *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->animal);
  return __return_storage_ptr__;
}

Assistant:

string Parser::get_animal() {
    return animal;
}